

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_parser.hpp
# Opt level: O0

void __thiscall
jsoncons::bson::basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_>::read_e_name
          (basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_> *this,
          json_visitor *visitor,bson_container_type type,error_code *ec)

{
  bool bVar1;
  error_code *this_00;
  ser_context *context;
  size_type __len;
  error_code *in_RCX;
  int in_EDX;
  string_view_type *in_RSI;
  string_type *in_RDI;
  type tVar2;
  type result;
  error_code *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa8;
  bson_errc __e;
  error_code *in_stack_ffffffffffffffb0;
  basic_bson_parser<jsoncons::bytes_source,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  
  __e = (bson_errc)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  std::__cxx11::string::clear();
  read_cstring(in_stack_ffffffffffffffc0,in_RDI,in_stack_ffffffffffffffb0);
  bVar1 = std::error_code::operator_cast_to_bool(in_RCX);
  if ((!bVar1) && (in_EDX == 0)) {
    this_00 = (error_code *)std::__cxx11::string::data();
    std::__cxx11::string::size();
    tVar2 = unicode_traits::validate<char>((char *)in_stack_ffffffffffffffc0,(size_t)in_RDI);
    if (tVar2.ec == success) {
      context = (ser_context *)std::__cxx11::string::data();
      __len = std::__cxx11::string::length();
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)&stack0xffffffffffffffc0,
                 (char *)context,__len);
      basic_json_visitor<char>::key
                ((basic_json_visitor<char> *)this_00,in_RSI,context,in_stack_ffffffffffffff98);
      *(byte *)&in_RDI->_M_string_length =
           (*(byte *)((long)&in_RDI->_M_string_length + 2) ^ 0xff) & 1;
    }
    else {
      std::error_code::operator=(this_00,__e);
      *(undefined1 *)&in_RDI->_M_string_length = 0;
    }
  }
  return;
}

Assistant:

void read_e_name(json_visitor& visitor, jsoncons::bson::bson_container_type type, std::error_code& ec)
    {
        name_buffer_.clear();
        read_cstring(name_buffer_, ec);
        if (JSONCONS_UNLIKELY(ec))
        {
            return;
        }
        if (type == jsoncons::bson::bson_container_type::document)
        {
            auto result = unicode_traits::validate(name_buffer_.data(),name_buffer_.size());
            if (JSONCONS_UNLIKELY(result.ec != unicode_traits::conv_errc()))
            {
                ec = bson_errc::invalid_utf8_text_string;
                more_ = false;
                return;
            }
            visitor.key(jsoncons::basic_string_view<char>(name_buffer_.data(),name_buffer_.length()), *this, ec);
            more_ = !cursor_mode_;
        }
    }